

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  xml_node_struct *pxVar1;
  xml_node xVar2;
  char *__s;
  size_t sVar3;
  xml_node_struct *i;
  xml_node_struct *pxVar4;
  xml_node_struct **ppxVar5;
  long lVar6;
  
  pxVar1 = this->_root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar6 = 0;
    for (pxVar4 = pxVar1; pxVar4 != (xml_node_struct *)0x0; pxVar4 = pxVar4->parent) {
      if (pxVar4->name == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(pxVar4->name);
      }
      lVar6 = lVar6 + (ulong)(pxVar4 != pxVar1) + sVar3;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    ppxVar5 = &this->_root;
    while (xVar2._root = *ppxVar5, xVar2._root != (xml_node_struct *)0x0) {
      if (xVar2._root != this->_root) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar6 + -1] = delimiter;
        lVar6 = lVar6 + -1;
      }
      __s = (xVar2._root)->name;
      if (__s != (char *)0x0) {
        sVar3 = strlen(__s);
        lVar6 = lVar6 - sVar3;
        memcpy((__return_storage_ptr__->_M_dataplus)._M_p + lVar6,__s,sVar3);
      }
      ppxVar5 = &(xVar2._root)->parent;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			offset += (i != _root);
			offset += i->name ? impl::strlength(i->name) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			if (j->name)
			{
				size_t length = impl::strlength(j->name);

				offset -= length;
				memcpy(&result[offset], j->name, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}